

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_bam_from_start.cc
# Opt level: O3

int parse_bam_from_start(int argc,char **argv)

{
  char *__s;
  int iVar1;
  htsFile *fp;
  bam_hdr_t *h;
  bam1_t *b;
  size_t sVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  long lVar5;
  string seq;
  string qual;
  string region_;
  string bam;
  char *local_c0;
  long local_b8;
  char local_b0;
  undefined7 uStack_af;
  char *local_a0;
  long local_98;
  char local_90;
  undefined7 uStack_8f;
  long *local_80 [2];
  long local_70 [2];
  bam_hdr_t *local_60;
  htsFile *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (argc < 2) {
    usage();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[1],(allocator<char> *)local_80);
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,".","");
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,argv[2],(allocator<char> *)&local_a0);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
    }
    if (local_48 != 0) {
      fp = hts_open((char *)local_50,"r");
      if (fp == (htsFile *)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Unable to open BAM/SAM file.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      h = sam_hdr_read(fp);
      if (h == (bam_hdr_t *)0x0) {
        hts_close(fp);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Unable to open BAM header.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b = bam_init1();
      local_60 = h;
      local_58 = fp;
      while( true ) {
        iVar1 = sam_read1(fp,h,b);
        if (iVar1 < 0) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read Chr: ",10);
        __s = h->target_name[(b->core).tid];
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1542e0);
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tPos: ",6);
        std::ostream::operator<<((ostream *)&std::cout,(b->core).pos);
        local_b8 = 0;
        local_b0 = '\0';
        local_a0 = &local_90;
        local_98 = 0;
        local_90 = '\0';
        local_c0 = &local_b0;
        if (0 < (b->core).l_qseq) {
          lVar5 = 0;
          do {
            std::__cxx11::string::push_back((char)&local_c0);
            std::__cxx11::string::push_back((char)&local_a0);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (b->core).l_qseq);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tSeq: ",6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_c0,local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tQual: ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_a0,local_98);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        if (local_a0 != &local_90) {
          operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
        }
        fp = local_58;
        h = local_60;
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
        }
      }
      bam_destroy1(b);
      bam_hdr_destroy(h);
      hts_close(fp);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return 0;
}

Assistant:

int parse_bam_from_start(int argc, char* argv[]) {
    if(argc < 2) {
        return usage();
    }
    string bam = string(argv[1]);
    string region_ = ".";
    if(argc > 2) {
        region_ = string(argv[2]);
    }
    if(!bam.empty()) {
        //open BAM for reading
        samFile *in = sam_open(bam.c_str(), "r");
        if(in == NULL) {
            throw runtime_error("Unable to open BAM/SAM file.");
        }
        //Get the header
        bam_hdr_t *header = sam_hdr_read(in);
        if(header == NULL) {
            sam_close(in);
            throw runtime_error("Unable to open BAM header.");
        }
        //Initiate the alignment record
        bam1_t *aln = bam_init1();
        while(sam_read1(in, header, aln) >= 0) {
            cout << "Read Chr: " << header->target_name[aln->core.tid];
            cout << "\tPos: " << aln->core.pos;
            string seq, qual;
            uint8_t *quali = bam_get_qual(aln);
            uint8_t *seqi = bam_get_seq(aln);
            for (int i = 0; i < aln->core.l_qseq; i++) {
                seq += seq_nt16_str[bam_seqi(seqi, i)];
                qual += 33 + quali[i];
            }
            cout << "\tSeq: " << seq << "\tQual: " << qual;
            cout << endl;
        }
        bam_destroy1(aln);
        bam_hdr_destroy(header);
        sam_close(in);
    }
    return 0;
}